

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

CTcSymbol * CTcSymObjBase::read_from_sym_file(CVmFile *fp)

{
  tc_metaclass_t tVar1;
  tc_symtype_t tVar2;
  tc_metaclass_t tVar3;
  tctarg_obj_id_t tVar4;
  uint uVar5;
  CTcSymObjBase *this;
  CTcSymObjBase *pCVar6;
  size_t tmp_buf_len;
  size_t sc_len;
  char *sc_txt;
  char buf [81];
  CTcSymbol *old_sym;
  size_t i;
  size_t cnt;
  char c;
  CTcSymObj *sym;
  tc_metaclass_t meta;
  char *txt;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  CTcPrsSymtab *in_stack_ffffffffffffff10;
  CVmFile *this_00;
  undefined4 in_stack_ffffffffffffff30;
  CTcPrsSymtab *in_stack_ffffffffffffff38;
  CTcSymObjBase *in_stack_ffffffffffffff40;
  tc_metaclass_t in_stack_ffffffffffffff50;
  CTcDictEntry *in_stack_ffffffffffffff58;
  CVmFile *in_stack_ffffffffffffff60;
  ulong local_40;
  byte local_29;
  CTcSymObjBase *local_8;
  
  this = (CTcSymObjBase *)CTcSymbolBase::base_read_from_sym_file(in_stack_ffffffffffffff60);
  if (this == (CTcSymObjBase *)0x0) {
    local_8 = (CTcSymObjBase *)0x0;
  }
  else {
    tVar1 = CVmFile::read_uint2((CVmFile *)in_stack_ffffffffffffff10);
    if ((tVar1 == TC_META_DICT) || (tVar1 == TC_META_GRAMPROD)) {
      in_stack_ffffffffffffff38 = CTcParser::get_global_symtab(G_prs);
      in_stack_ffffffffffffff40 = this;
      strlen((char *)this);
      pCVar6 = (CTcSymObjBase *)
               CTcPrsSymtab::find(in_stack_ffffffffffffff10,
                                  (textchar_t *)
                                  CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                  0x20d7b7);
      if ((pCVar6 != (CTcSymObjBase *)0x0) &&
         ((tVar2 = CTcSymbolBase::get_type((CTcSymbolBase *)pCVar6), tVar2 == TC_SYM_OBJ &&
          (tVar3 = get_metaclass(pCVar6), tVar3 == tVar1)))) {
        return &pCVar6->super_CTcSymbol;
      }
    }
    local_8 = (CTcSymObjBase *)CTcSymbolBase::operator_new(0x20d813);
    tmp_buf_len = strlen((char *)this);
    tVar4 = CTcGenTarg::new_obj_id(G_cg);
    this_00 = (CVmFile *)0x0;
    CTcSymObj::CTcSymObj
              ((CTcSymObj *)in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
               CONCAT44(tVar4,in_stack_ffffffffffffff30),(int)(tmp_buf_len >> 0x20),
               (vm_obj_id_t)tmp_buf_len,(int)((ulong)this >> 0x20),in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff58);
    if (tVar1 == TC_META_TADSOBJ) {
      pCVar6 = local_8;
      CVmFile::read_bytes((CVmFile *)this,(char *)local_8,(size_t)this_00);
      set_sc_is_root(local_8,(uint)((local_29 & 1) != 0));
      set_is_class(local_8,(uint)((local_29 & 2) != 0));
      if ((local_29 & 4) != 0) {
        set_transient(local_8);
      }
      uVar5 = CVmFile::read_uint2(this_00);
      for (local_40 = 0; local_40 < uVar5; local_40 = local_40 + 1) {
        CTcParser::read_len_prefix_str
                  ((CVmFile *)in_stack_ffffffffffffff38,
                   (char *)CONCAT44(tVar4,in_stack_ffffffffffffff30),tmp_buf_len,(size_t *)this,
                   (int)((ulong)pCVar6 >> 0x20));
        add_sc_name_entry(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
                          CONCAT44(tVar4,in_stack_ffffffffffffff30));
      }
    }
  }
  return &local_8->super_CTcSymbol;
}

Assistant:

CTcSymbol *CTcSymObjBase::read_from_sym_file(CVmFile *fp)
{
    const char *txt;
    tc_metaclass_t meta;
    CTcSymObj *sym;
    char c;
    size_t cnt;
    size_t i;

    /* read the symbol name */
    if ((txt = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read the metaclass ID */
    meta = (tc_metaclass_t)fp->read_uint2();

    /* 
     *   If it's a dictionary object, check to see if it's already defined -
     *   a dictionary object can be exported from multiple modules without
     *   error, since dictionaries are shared across modules.
     *   
     *   The same applies to grammar productions, since a grammar production
     *   can be implicitly created in multiple files.  
     */
    if (meta == TC_META_DICT || meta == TC_META_GRAMPROD)
    {
        /* look for a previous instance of the symbol */
        CTcSymbol *old_sym =
            G_prs->get_global_symtab()->find(txt, strlen(txt));
        if (old_sym != 0
            && old_sym->get_type() == TC_SYM_OBJ
            && ((CTcSymObj *)old_sym)->get_metaclass() == meta)
        {
            /* 
             *   the dictionary is already in the symbol table - return the
             *   existing one, since there's no conflict with importing the
             *   dictionary from multiple places 
             */
            return old_sym;
        }
    }

    /* create the new symbol */
    sym = new CTcSymObj(txt, strlen(txt), FALSE, G_cg->new_obj_id(),
                        TRUE, meta, 0);

    /* if the metaclass is tads-object, read additional information */
    if (meta == TC_META_TADSOBJ)
    {
        /* read the root-object-superclass flag and the class-object flag */
        fp->read_bytes(&c, 1);
        sym->set_sc_is_root((c & 1) != 0);
        sym->set_is_class((c & 2) != 0);
        if ((c & 4) != 0)
            sym->set_transient();

        /* read the number of superclasses, and read the superclass names */
        cnt = fp->read_uint2();
        for (i = 0 ; i < cnt ; ++i)
        {
            char buf[TOK_SYM_MAX_LEN + 1];
            const char *sc_txt;
            size_t sc_len;

            /* read the symbol */
            sc_txt = CTcParser::read_len_prefix_str(
                fp, buf, sizeof(buf), &sc_len, TCERR_SYMEXP_SYM_TOO_LONG);

            /* add the superclass list entry to the symbol */
            sym->add_sc_name_entry(sc_txt, sc_len);
        }
    }

    /* return the symbol */
    return sym;
}